

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_optimization.cc
# Opt level: O2

void __thiscall
QPDF::pushInheritedAttributesToPageInternal
          (QPDF *this,QPDFObjectHandle *cur_pages,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>_>_>
          *key_ancestors,bool allow_changes,bool warn_skipped_keys)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  _Rb_tree_node_base *__k;
  element_type *peVar1;
  _Head_base<0UL,_QPDF::Members_*,_false> _Var2;
  QPDFObjectHandle *pQVar3;
  bool bVar4;
  mapped_type *pmVar5;
  element_type *peVar6;
  QPDFObjGen og;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *this_00;
  _Base_ptr p_Var7;
  _Rb_tree_node_base *p_Var8;
  QPDFExc *this_01;
  string *psVar9;
  qpdf_offset_t offset;
  string *key;
  undefined7 in_register_00000081;
  allocator<char> local_142;
  allocator<char> local_141;
  QPDFObjectHandle *local_140;
  undefined8 local_138;
  undefined4 local_12c;
  QPDFObjectHandle oh;
  QPDFArrayItems local_100;
  iterator __begin1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_a0;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_90;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  inheritable_keys;
  string local_50;
  
  inheritable_keys._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &inheritable_keys._M_t._M_impl.super__Rb_tree_header._M_header;
  inheritable_keys._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  inheritable_keys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  inheritable_keys._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_140 = (QPDFObjectHandle *)this;
  inheritable_keys._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       inheritable_keys._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  QPDFObjectHandle::getKeys_abi_cxx11_
            ((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&__begin1,cur_pages);
  local_12c = (undefined4)CONCAT71(in_register_00000081,warn_skipped_keys);
  peVar6 = __begin1.ivalue.super_BaseHandle.obj.
           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_138 = (string *)cur_pages;
  do {
    if (peVar6 == (element_type *)&__begin1.m) {
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&__begin1);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&__begin1,"/Kids",(allocator<char> *)&local_c0);
      QPDFObjectHandle::getKey(&oh,(string *)cur_pages);
      QPDFObjectHandle::aitems(&local_100.oh);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&oh.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
      std::__cxx11::string::~string((string *)&__begin1);
      QPDFObjectHandle::QPDFArrayItems::begin(&__begin1,&local_100);
      QPDFObjectHandle::QPDFArrayItems::end((iterator *)&oh,&local_100);
      local_138 = (string *)(CONCAT44(local_138._4_4_,local_12c) & 0xffffffff000000ff);
      while( true ) {
        bVar4 = QPDFObjectHandle::QPDFArrayItems::iterator::operator!=(&__begin1,(iterator *)&oh);
        if (!bVar4) break;
        this_00 = (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)
                  QPDFObjectHandle::QPDFArrayItems::iterator::operator*(&__begin1);
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,"/Pages",&local_141);
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"",&local_142);
        bVar4 = QPDFObjectHandle::isDictionaryOfType
                          ((QPDFObjectHandle *)this_00,&local_c0,&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)&local_c0);
        if (bVar4) {
          std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr(&local_a0,this_00)
          ;
          pushInheritedAttributesToPageInternal
                    ((QPDF *)local_140,(QPDFObjectHandle *)&local_a0,key_ancestors,allow_changes,
                     SUB81(local_138,0));
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_a0._M_refcount);
        }
        else {
          for (p_Var7 = (key_ancestors->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
              (_Rb_tree_header *)p_Var7 != &(key_ancestors->_M_t)._M_impl.super__Rb_tree_header;
              p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7)) {
            bVar4 = QPDFObjectHandle::hasKey((QPDFObjectHandle *)this_00,(string *)(p_Var7 + 1));
            if (!bVar4) {
              QPDFObjectHandle::replaceKey
                        ((QPDFObjectHandle *)this_00,(string *)(p_Var7 + 1),
                         (QPDFObjectHandle *)&p_Var7[2]._M_parent[-1]._M_left);
            }
          }
        }
        QPDFObjectHandle::QPDFArrayItems::iterator::operator++(&__begin1);
      }
      QPDFObjectHandle::QPDFArrayItems::iterator::~iterator((iterator *)&oh);
      QPDFObjectHandle::QPDFArrayItems::iterator::~iterator(&__begin1);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_100.oh.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      p_Var8 = inheritable_keys._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      if (inheritable_keys._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
        for (; (_Rb_tree_header *)p_Var8 != &inheritable_keys._M_t._M_impl.super__Rb_tree_header;
            p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8)) {
          __k = p_Var8 + 1;
          pmVar5 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>_>_>
                   ::operator[](key_ancestors,(key_type *)__k);
          std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::pop_back(pmVar5);
          pmVar5 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>_>_>
                   ::operator[](key_ancestors,(key_type *)__k);
          if ((pmVar5->super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>).
              _M_impl.super__Vector_impl_data._M_start ==
              (pmVar5->super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>).
              _M_impl.super__Vector_impl_data._M_finish) {
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>_>_>
            ::erase(&key_ancestors->_M_t,(key_type *)__k);
          }
        }
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree(&inheritable_keys._M_t);
      return;
    }
    __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            ((long)&(peVar6->value).
                    super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                    .
                    super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                    .
                    super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                    .
                    super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                    .
                    super__Copy_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                    .
                    super__Variant_storage_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
            + 0x20);
    bVar4 = std::operator==(__lhs,"/MediaBox");
    if ((((bVar4) || (bVar4 = std::operator==(__lhs,"/CropBox"), bVar4)) ||
        (bVar4 = std::operator==(__lhs,"/Resources"), bVar4)) ||
       (bVar4 = std::operator==(__lhs,"/Rotate"), bVar4)) {
      if (!allow_changes) {
        this_01 = (QPDFExc *)__cxa_allocate_exception(0x80);
        psVar9 = (string *)
                 (**(code **)(**(long **)&(((((tuple<QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                                               *)&(local_140->super_BaseHandle).obj.
                                                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr)->
                                            super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                                            ).super__Head_base<0UL,_QPDF::Members_*,_false>.
                                           _M_head_impl)->file).
                                          super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>
                             + 0x18))();
        _Var2._M_head_impl =
             (((tuple<QPDF::Members_*,_std::default_delete<QPDF::Members>_> *)
              &(local_140->super_BaseHandle).obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>).
             super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
        offset = InputSource::getLastOffset
                           (((_Var2._M_head_impl)->file).
                            super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&oh,
                   "optimize detected an inheritable attribute when called in no-change mode",
                   (allocator<char> *)&local_c0);
        QPDFExc::QPDFExc(this_01,qpdf_e_internal,psVar9,
                         &(_Var2._M_head_impl)->last_object_description,offset,(string *)&oh);
        __cxa_throw(this_01,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
      }
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string_const&>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)&inheritable_keys,__lhs);
      QPDFObjectHandle::getKey(&oh,(string *)cur_pages);
      QPDFObjectHandle::isIndirect(&oh);
      bVar4 = QPDFObjectHandle::isIndirect(&oh);
      if ((!bVar4) && (bVar4 = QPDFObjectHandle::isScalar(&oh), !bVar4)) {
        std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_90,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&oh);
        makeIndirectObject((QPDF *)&local_c0,local_140);
        psVar9 = local_138;
        QPDFObjectHandle::replaceKey
                  ((QPDFObjectHandle *)local_138,__lhs,(QPDFObjectHandle *)&local_c0);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_c0._M_string_length);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_90._M_refcount);
        QPDFObjectHandle::getKey((QPDFObjectHandle *)&local_c0,psVar9);
        std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::operator=
                  ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&oh,
                   (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&local_c0);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_c0._M_string_length);
        cur_pages = (QPDFObjectHandle *)local_138;
      }
      pmVar5 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>_>_>
               ::operator[](key_ancestors,__lhs);
      std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::push_back
                (pmVar5,(value_type *)&oh);
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>_>_>
      ::operator[](key_ancestors,__lhs);
      QPDFObjectHandle::removeKey(cur_pages,__lhs);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&oh.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
    }
    else {
      bVar4 = std::operator==(__lhs,"/Type");
      if (((!bVar4) && (bVar4 = std::operator==(__lhs,"/Parent"), !bVar4)) &&
         ((bVar4 = std::operator==(__lhs,"/Kids"), !bVar4 &&
          (bVar4 = std::operator==(__lhs,"/Count"), !bVar4 && warn_skipped_keys)))) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&oh,"/Parent",(allocator<char> *)&local_c0);
        bVar4 = QPDFObjectHandle::hasKey
                          (cur_pages,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&oh)
        ;
        std::__cxx11::string::~string((string *)&oh);
        if (bVar4) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&oh,"Pages object",(allocator<char> *)&local_c0);
          og = QPDFObjectHandle::getObjGen(cur_pages);
          pQVar3 = local_140;
          setLastObjectDescription
                    ((QPDF *)local_140,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&oh,og);
          std::__cxx11::string::~string((string *)&oh);
          peVar1 = (pQVar3->super_BaseHandle).obj.
                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          std::operator+(&local_c0,"Unknown key ",__lhs);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&oh,
                         &local_c0,
                         " in /Pages object is being discarded as a result of flattening the /Pages tree"
                        );
          warn((QPDF *)local_140,qpdf_e_pages,(string *)(peVar1 + 2),0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&oh);
          std::__cxx11::string::~string((string *)&oh);
          std::__cxx11::string::~string((string *)&local_c0);
          cur_pages = (QPDFObjectHandle *)local_138;
        }
      }
    }
    peVar6 = (element_type *)std::_Rb_tree_increment((_Rb_tree_node_base *)peVar6);
  } while( true );
}

Assistant:

void
QPDF::pushInheritedAttributesToPageInternal(
    QPDFObjectHandle cur_pages,
    std::map<std::string, std::vector<QPDFObjectHandle>>& key_ancestors,
    bool allow_changes,
    bool warn_skipped_keys)
{
    // Make a list of inheritable keys. Only the keys /MediaBox, /CropBox, /Resources, and /Rotate
    // are inheritable attributes. Push this object onto the stack of pages nodes that have values
    // for this attribute.

    std::set<std::string> inheritable_keys;
    for (auto const& key: cur_pages.getKeys()) {
        if ((key == "/MediaBox") || (key == "/CropBox") || (key == "/Resources") ||
            (key == "/Rotate")) {
            if (!allow_changes) {
                throw QPDFExc(
                    qpdf_e_internal,
                    m->file->getName(),
                    m->last_object_description,
                    m->file->getLastOffset(),
                    "optimize detected an inheritable attribute when called in no-change mode");
            }

            // This is an inheritable resource
            inheritable_keys.insert(key);
            QPDFObjectHandle oh = cur_pages.getKey(key);
            QTC::TC("qpdf", "QPDF opt direct pages resource", oh.isIndirect() ? 0 : 1);
            if (!oh.isIndirect()) {
                if (!oh.isScalar()) {
                    // Replace shared direct object non-scalar resources with indirect objects to
                    // avoid copying large structures around.
                    cur_pages.replaceKey(key, makeIndirectObject(oh));
                    oh = cur_pages.getKey(key);
                } else {
                    // It's okay to copy scalars.
                    QTC::TC("qpdf", "QPDF opt inherited scalar");
                }
            }
            key_ancestors[key].push_back(oh);
            if (key_ancestors[key].size() > 1) {
                QTC::TC("qpdf", "QPDF opt key ancestors depth > 1");
            }
            // Remove this resource from this node.  It will be reattached at the page level.
            cur_pages.removeKey(key);
        } else if (!((key == "/Type") || (key == "/Parent") || (key == "/Kids") ||
                     (key == "/Count"))) {
            // Warn when flattening, but not if the key is at the top level (i.e. "/Parent" not
            // set), as we don't change these; but flattening removes intermediate /Pages nodes.
            if ((warn_skipped_keys) && (cur_pages.hasKey("/Parent"))) {
                QTC::TC("qpdf", "QPDF unknown key not inherited");
                setLastObjectDescription("Pages object", cur_pages.getObjGen());
                warn(
                    qpdf_e_pages,
                    m->last_object_description,
                    0,
                    ("Unknown key " + key +
                     " in /Pages object is being discarded as a result of flattening the /Pages "
                     "tree"));
            }
        }
    }

    // Process descendant nodes. This method does not perform loop detection because all code paths
    // that lead here follow a call to getAllPages, which already throws an exception in the event
    // of a loop in the pages tree.
    for (auto& kid: cur_pages.getKey("/Kids").aitems()) {
        if (kid.isDictionaryOfType("/Pages")) {
            pushInheritedAttributesToPageInternal(
                kid, key_ancestors, allow_changes, warn_skipped_keys);
        } else {
            // Add all available inheritable attributes not present in this object to this object.
            for (auto const& iter: key_ancestors) {
                std::string const& key = iter.first;
                if (!kid.hasKey(key)) {
                    QTC::TC("qpdf", "QPDF opt resource inherited");
                    kid.replaceKey(key, iter.second.back());
                } else {
                    QTC::TC("qpdf", "QPDF opt page resource hides ancestor");
                }
            }
        }
    }

    // For each inheritable key, pop the stack.  If the stack becomes empty, remove it from the map.
    // That way, the invariant that the list of keys in key_ancestors is exactly those keys for
    // which inheritable attributes are available.

    if (!inheritable_keys.empty()) {
        QTC::TC("qpdf", "QPDF opt inheritable keys");
        for (auto const& key: inheritable_keys) {
            key_ancestors[key].pop_back();
            if (key_ancestors[key].empty()) {
                QTC::TC("qpdf", "QPDF opt erase empty key ancestor");
                key_ancestors.erase(key);
            }
        }
    } else {
        QTC::TC("qpdf", "QPDF opt no inheritable keys");
    }
}